

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O1

void __thiscall FParser::SF_PlayerObj(FParser *this)

{
  AActor *pAVar1;
  int iVar2;
  player_t *ppVar3;
  
  if (this->t_argc != 0) {
    iVar2 = T_GetPlayerNum(this->t_argv);
    goto LAB_00508cb5;
  }
  pAVar1 = (this->Script->trigger).field_0.p;
  if (pAVar1 == (AActor *)0x0) {
LAB_00508c96:
    ppVar3 = (player_t *)0x0;
  }
  else {
    if (((pAVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (this->Script->trigger).field_0.p = (AActor *)0x0;
      goto LAB_00508c96;
    }
    ppVar3 = ((this->Script->trigger).field_0.p)->player;
  }
  if (ppVar3 == (player_t *)0x0) {
    iVar2 = -1;
  }
  else {
    iVar2 = (int)((ulong)&ppVar3[-0x91ab].ConversationNPCAngle >> 5) * 0x3cf3cf3d;
  }
LAB_00508cb5:
  if (iVar2 != -1) {
    (this->t_return).type = 2;
    (this->t_return).value = *(anon_union_8_3_837bfa25_for_value *)(&players + (long)iVar2 * 0x54);
    return;
  }
  script_error("script not started by player\n");
  return;
}

Assistant:

void FParser::SF_PlayerObj(void)
{
	int plnum;

	if(!t_argc)
	{
		player_t *pl=NULL;
		if (Script->trigger) pl = Script->trigger->player;
		if(pl) plnum = int(pl - players);
		else plnum=-1;
	}
	else
		plnum = T_GetPlayerNum(t_argv[0]);

	if(plnum !=-1)
	{
		t_return.type = svt_mobj;
		t_return.value.mobj = players[plnum].mo;
	}
	else
	{
		script_error("script not started by player\n");
	}
}